

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O1

void __thiscall spvtools::opt::IRContext::BuildLivenessManager(IRContext *this)

{
  byte *pbVar1;
  LivenessManager *this_00;
  
  this_00 = (LivenessManager *)operator_new(0x80);
  analysis::LivenessManager::LivenessManager(this_00,this);
  std::
  __uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
  ::reset((__uniq_ptr_impl<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
           *)&this->liveness_mgr_,this_00);
  pbVar1 = (byte *)((long)&this->valid_analyses_ + 2);
  *pbVar1 = *pbVar1 | 2;
  return;
}

Assistant:

void BuildLivenessManager() {
    liveness_mgr_ = MakeUnique<analysis::LivenessManager>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisLiveness;
  }